

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O2

void ngram_search_update_widmap(ngram_search_t *ngs)

{
  uint n_words;
  char **words;
  long lVar1;
  ulong uVar2;
  
  n_words = (ngs->base).n_words;
  words = (char **)__ckd_calloc__((long)(int)n_words,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                  ,0x53);
  lVar1 = 0;
  uVar2 = 0;
  if (0 < (int)n_words) {
    uVar2 = (ulong)n_words;
  }
  for (; uVar2 * 8 != lVar1; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)words + lVar1) =
         *(undefined8 *)((long)&((ngs->base).dict)->word->word + lVar1 * 4);
  }
  ngram_model_set_map_words(ngs->lmset,words,n_words);
  ckd_free(words);
  return;
}

Assistant:

static void
ngram_search_update_widmap(ngram_search_t *ngs)
{
    char const **words;
    int32 i, n_words;

    /* It's okay to include fillers since they won't be in the LM */
    n_words = ps_search_n_words(ngs);
    words = (char const**)ckd_calloc(n_words, sizeof(*words));
    /* This will include alternates, again, that's okay since they aren't in the LM */
    for (i = 0; i < n_words; ++i)
        words[i] = dict_wordstr(ps_search_dict(ngs), i);
    ngram_model_set_map_words(ngs->lmset, words, n_words);
    ckd_free(words);
}